

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

int ShowDemoWindowWidgets::Funcs::MyCallback(ImGuiInputTextCallbackData *data)

{
  char cVar1;
  ImGuiInputTextCallbackData *in_RDI;
  int *p_int;
  char c;
  char *in_stack_00000018;
  char *in_stack_00000020;
  int in_stack_0000002c;
  ImGuiInputTextCallbackData *in_stack_00000030;
  
  if (in_RDI->EventFlag == 0x40) {
    ImGuiInputTextCallbackData::InsertChars
              (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_00000018);
  }
  else if (in_RDI->EventFlag == 0x80) {
    if (in_RDI->EventKey == 0x203) {
      ImGuiInputTextCallbackData::DeleteChars(in_RDI,0,in_RDI->BufTextLen);
      ImGuiInputTextCallbackData::InsertChars
                (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_00000018);
      ImGuiInputTextCallbackData::SelectAll(in_RDI);
    }
    else if (in_RDI->EventKey == 0x204) {
      ImGuiInputTextCallbackData::DeleteChars(in_RDI,0,in_RDI->BufTextLen);
      ImGuiInputTextCallbackData::InsertChars
                (in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_00000018);
      ImGuiInputTextCallbackData::SelectAll(in_RDI);
    }
  }
  else if (in_RDI->EventFlag == 0x80000) {
    cVar1 = *in_RDI->Buf;
    if ((('`' < cVar1) && (cVar1 < '{')) || (('@' < cVar1 && (cVar1 < '[')))) {
      *in_RDI->Buf = *in_RDI->Buf ^ 0x20;
    }
    in_RDI->BufDirty = true;
    *(int *)in_RDI->UserData = *in_RDI->UserData + 1;
  }
  return 0;
}

Assistant:

static int MyCallback(ImGuiInputTextCallbackData* data)
                {
                    if (data->EventFlag == ImGuiInputTextFlags_CallbackCompletion)
                    {
                        data->InsertChars(data->CursorPos, "..");
                    }
                    else if (data->EventFlag == ImGuiInputTextFlags_CallbackHistory)
                    {
                        if (data->EventKey == ImGuiKey_UpArrow)
                        {
                            data->DeleteChars(0, data->BufTextLen);
                            data->InsertChars(0, "Pressed Up!");
                            data->SelectAll();
                        }
                        else if (data->EventKey == ImGuiKey_DownArrow)
                        {
                            data->DeleteChars(0, data->BufTextLen);
                            data->InsertChars(0, "Pressed Down!");
                            data->SelectAll();
                        }
                    }
                    else if (data->EventFlag == ImGuiInputTextFlags_CallbackEdit)
                    {
                        // Toggle casing of first character
                        char c = data->Buf[0];
                        if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z')) data->Buf[0] ^= 32;
                        data->BufDirty = true;

                        // Increment a counter
                        int* p_int = (int*)data->UserData;
                        *p_int = *p_int + 1;
                    }
                    return 0;
                }